

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O2

value_ptr __thiscall pstore::dump::make_value(dump *this,trailer *trailer,bool no_times)

{
  atomic<unsigned_int> *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar2;
  value_ptr vVar3;
  initializer_list<pstore::dump::object::member> __l;
  address in_stack_fffffffffffffc70;
  allocator local_388;
  allocator local_387;
  allocator local_386;
  allocator local_385;
  allocator local_384;
  allocator local_383;
  allocator local_382;
  allocator local_381;
  value_ptr local_380;
  value_ptr local_370;
  value_ptr local_360;
  value_ptr local_350;
  value_ptr local_340;
  value_ptr local_330;
  value_ptr local_320;
  value_ptr local_310;
  __int_type_conflict local_2fc;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_2f8;
  trailer *local_2e0;
  array<unsigned_char,_8UL> *local_2d8;
  string local_2d0;
  string local_2b0;
  uint32_t *local_290;
  index_records_array *local_288;
  string local_280;
  string local_260;
  string local_240;
  __int_type_conflict1 local_220;
  string local_218;
  string local_1f8;
  atomic<unsigned_int> *local_1d8;
  trailer *local_1d0;
  string local_1c8;
  member local_1a8 [4];
  member local_e8;
  member local_b8;
  member local_88;
  member local_58;
  
  std::__cxx11::string::string((string *)&local_1c8,"signature1",&local_381);
  paVar1 = &(trailer->a).generation;
  local_1d8 = paVar1;
  local_1d0 = trailer;
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_310,(uchar **)&local_1d0,(uchar **)&local_1d8,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(local_1a8,&local_1c8,&local_310);
  std::__cxx11::string::string((string *)&local_1f8,"generation",&local_382);
  local_2fc = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  make_value((uint32_t *)&local_320);
  object::member::member(local_1a8 + 1,&local_1f8,&local_320);
  std::__cxx11::string::string((string *)&local_218,"size",&local_383);
  local_220 = (trailer->a).size.super___atomic_base<unsigned_long>._M_i;
  make_value((uint64_t *)&local_330);
  object::member::member(local_1a8 + 2,&local_218,&local_330);
  std::__cxx11::string::string((string *)&local_240,"time",&local_384);
  make_time((dump *)&local_340,(trailer->a).time.super___atomic_base<unsigned_long>._M_i,no_times);
  object::member::member(local_1a8 + 3,&local_240,&local_340);
  std::__cxx11::string::string((string *)&local_260,"prev_generation",&local_385);
  make_value(in_stack_fffffffffffffc70);
  object::member::member(&local_e8,&local_260,&local_350);
  std::__cxx11::string::string((string *)&local_280,"indices",&local_386);
  local_288 = &(trailer->a).index_records;
  local_290 = &(trailer->a).unused2;
  make_value<pstore::typed_address<pstore::index::header_block>const*,pstore::typed_address<pstore::index::header_block>,std::shared_ptr<pstore::dump::value>(*)(pstore::typed_address<pstore::index::header_block>const&)>
            ((dump *)&local_360,(typed_address<pstore::index::header_block> **)&local_288,
             (typed_address<pstore::index::header_block> **)&local_290,
             details::default_make_value<pstore::typed_address<pstore::index::header_block>const&>);
  object::member::member(&local_b8,&local_280,&local_360);
  std::__cxx11::string::string((string *)&local_2b0,"crc",&local_387);
  make_value((uint32_t *)&local_370);
  object::member::member(&local_88,&local_2b0,&local_370);
  std::__cxx11::string::string((string *)&local_2d0,"signature2",&local_388);
  local_2d8 = &trailer->signature2;
  local_2e0 = trailer + 1;
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_380,(uchar **)&local_2d8,(uchar **)&local_2e0,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(&local_58,&local_2d0,&local_380);
  __l._M_len = 8;
  __l._M_array = local_1a8;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_2f8,__l,(allocator_type *)&stack0xfffffffffffffc77);
  make_value((container *)this);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_2f8);
  lVar2 = 0x150;
  do {
    object::member::~member((member *)((long)&local_1a8[0].property._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_380.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_370.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_360.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_280);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_350.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_340.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_240);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_330.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_320.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_310.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1c8);
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar3.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (trailer const & trailer, bool const no_times) {
            return make_value (object::container{
                {"signature1",
                 make_value (std::begin (trailer.a.signature1), std::end (trailer.a.signature1))},
                {"generation", make_value (trailer.a.generation.load ())},
                {"size", make_value (trailer.a.size.load ())},
                {"time", make_time (trailer.a.time, no_times)},
                {"prev_generation", make_value (trailer.a.prev_generation)},
                {"indices", make_value (std::begin (trailer.a.index_records),
                                        std::end (trailer.a.index_records))},
                {"crc", make_value (trailer.crc)},
                {"signature2",
                 make_value (std::begin (trailer.signature2), std::end (trailer.signature2))},
            });
        }